

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcolordialog.cpp
# Opt level: O0

void __thiscall QtPrivate::QColorPicker::QColorPicker(QColorPicker *this,QWidget *parent)

{
  long lVar1;
  QColorPicker *in_RSI;
  QWidget *in_RDI;
  long in_FS_OFFSET;
  bool in_stack_00000033;
  WidgetAttribute in_stack_00000034;
  QWidget *in_stack_00000038;
  int in_stack_00000068;
  int in_stack_0000006c;
  ControlType type;
  QWidget *pQVar2;
  anon_union_4_2_313b0b05_for_QSizePolicy_1 policy;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar2 = in_RDI;
  QFlags<Qt::WindowType>::QFlags((QFlags<Qt::WindowType> *)0x733435);
  policy.data = (quint32)((ulong)pQVar2 >> 0x20);
  QFrame::QFrame(&in_RSI->super_QFrame,in_RDI,(WindowFlags)policy.bits);
  *(undefined ***)in_RDI = &PTR_metaObject_00d20ae8;
  *(undefined ***)&in_RDI->super_QPaintDevice = &PTR__QColorPicker_00d20ca0;
  QPixmap::QPixmap((QPixmap *)&in_RDI[1].field_0x8);
  *(undefined1 *)&in_RDI[1].data = 1;
  *(undefined4 *)(in_RDI + 1) = 0;
  *(undefined4 *)&in_RDI[1].field_0x4 = 0;
  setCol(in_RSI,in_stack_0000006c,in_stack_00000068);
  type = DefaultType;
  QWidget::setAttribute(in_stack_00000038,in_stack_00000034,in_stack_00000033);
  QSizePolicy::QSizePolicy
            ((QSizePolicy *)in_RSI,(Policy)((ulong)in_RDI >> 0x20),(Policy)in_RDI,type);
  QWidget::setSizePolicy((QWidget *)in_RSI,(QSizePolicy)policy);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QColorPicker::QColorPicker(QWidget* parent)
    : QFrame(parent)
    , crossVisible(true)
{
    hue = 0; sat = 0;
    setCol(150, 255);

    setAttribute(Qt::WA_NoSystemBackground);
    setSizePolicy(QSizePolicy(QSizePolicy::Fixed, QSizePolicy::Fixed) );
}